

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O1

ExpansionBlock permutationBox(ExpansionBlock block)

{
  _Base_bitset<1UL> _Var1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  _Base_bitset<1UL> _Var5;
  bool bVar6;
  
  uVar2 = 0x1f;
  uVar3 = 0;
  _Var1._M_w = 0;
  do {
    uVar4 = _Var1._M_w & ~(1L << (uVar3 & 0x3f));
    _Var1._M_w = _Var1._M_w | 1L << (uVar3 & 0x3f);
    if (((ulong)block.super__Base_bitset<1UL>._M_w >> (uVar2 & 0x3f) & 1) == 0) {
      _Var1._M_w = uVar4;
    }
    uVar3 = uVar3 + 1;
    uVar2 = uVar2 - 1;
  } while (uVar3 != 0x10);
  uVar2 = 8;
  do {
    uVar3 = (ulong)((int)uVar2 + 8);
    uVar4 = _Var1._M_w & ~(1L << (uVar3 & 0x3f));
    _Var1._M_w = _Var1._M_w | 1L << (uVar3 & 0x3f);
    if (((ulong)block.super__Base_bitset<1UL>._M_w >> (uVar2 & 0x3f) & 1) == 0) {
      _Var1._M_w = uVar4;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x10);
  uVar2 = 0x18;
  uVar3 = 7;
  do {
    _Var5._M_w = _Var1._M_w & ~(1L << (uVar2 & 0x3f));
    _Var1._M_w = _Var1._M_w | 1L << (uVar2 & 0x3f);
    if (((ulong)block.super__Base_bitset<1UL>._M_w >> (uVar3 & 0x3f) & 1) == 0) {
      _Var1._M_w = _Var5._M_w;
    }
    uVar2 = uVar2 + 1;
    bVar6 = uVar3 != 0;
    uVar3 = uVar3 - 1;
  } while (bVar6);
  return (ExpansionBlock)_Var1._M_w;
}

Assistant:

ExpansionBlock permutationBox(ExpansionBlock block) {
    ExpansionBlock result;
    int i = 0;
    for ( ; i < EXPANSION_BLOCK_SIZE / 2; i++) {
        result[i] = block[EXPANSION_BLOCK_SIZE- i - 1];
    }

    for ( ; i < (EXPANSION_BLOCK_SIZE / 4) * 3; i++) {
        result[i] = block[i - 8];
    }

    for ( ; i < EXPANSION_BLOCK_SIZE; i++) {
        result[i] = block[EXPANSION_BLOCK_SIZE - i - 1];
    }

    return result;
}